

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_file.c
# Opt level: O2

void init_hduname(void)

{
  int iVar1;
  HduName **ppHVar2;
  HduName *pHVar3;
  ulong uVar4;
  ulong uVar5;
  
  iVar1 = totalhdu;
  ppHVar2 = (HduName **)malloc((long)totalhdu << 3);
  uVar4 = 0;
  uVar5 = 0;
  hduname = ppHVar2;
  if (0 < iVar1) {
    uVar5 = (ulong)(uint)iVar1;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    pHVar3 = (HduName *)calloc(1,0x5c);
    ppHVar2[uVar4] = pHVar3;
    pHVar3->hdutype = -1;
    pHVar3->wrnno = 0;
    pHVar3->extname[0] = '\0';
    pHVar3->extver = 0;
    pHVar3->errnum = 0;
  }
  return;
}

Assistant:

void init_hduname() 
{
    int i;
    /* allocate memories for the hdu structure array  */
    hduname = (HduName **)malloc(totalhdu*sizeof(HduName *));
    for (i=0; i < totalhdu; i++) { 
	hduname[i] = (HduName *)calloc(1, sizeof(HduName));
	hduname[i]->hdutype = -1;
        hduname[i]->errnum = 0; 
        hduname[i]->wrnno = 0;
        strcpy(hduname[i]->extname,"");
        hduname[i]->extver = 0;
    }
    return;
}